

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_sv.c
# Opt level: O1

adt_str_t * dtl_sv_to_str(dtl_sv_t *self,_Bool *ok)

{
  adt_str_t *str;
  
  if ((self != (dtl_sv_t *)0x0) && (str = (adt_str_t *)adt_str_new(), str != (adt_str_t *)0x0)) {
    dtl_sv_to_string_internal(self,str,ok);
    return str;
  }
  return (adt_str_t *)0x0;
}

Assistant:

adt_str_t* dtl_sv_to_str(const dtl_sv_t *self, bool* ok)
{
   adt_str_t *str = (adt_str_t*) 0;
   if(self != 0)
   {
      str = adt_str_new();
      if (str != 0)
      {
         dtl_sv_to_string_internal(self, str, ok);
      }
   }
   return str;
}